

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
* __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectSDLCreateWindow
          (SDLGraphicsSystemTests *this,string *title,uint width,uint height)

{
  WrapperMock *this_00;
  MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_01;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *pTVar1;
  WithoutMatchers local_159;
  Matcher<unsigned_int> local_158;
  Matcher<int> local_140;
  Matcher<int> local_128;
  Matcher<int> local_110;
  Matcher<int> local_e8;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d0;
  MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  local_b8;
  uint local_20;
  uint local_1c;
  uint height_local;
  uint width_local;
  string *title_local;
  SDLGraphicsSystemTests *this_local;
  
  local_20 = height;
  local_1c = width;
  _height_local = title;
  title_local = (string *)this;
  this_00 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*(&this->sdlMock)
             ->super_WrapperMock;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_d0,_height_local);
  testing::Matcher<int>::Matcher(&local_e8,0x1fff0000);
  testing::Matcher<int>::Matcher(&local_110,0x1fff0000);
  testing::Matcher<int>::Matcher(&local_128,local_1c);
  testing::Matcher<int>::Matcher(&local_140,local_20);
  testing::Matcher<unsigned_int>::Matcher(&local_158,4);
  SDL::WrapperMock::gmock_createWindow
            (&local_b8,this_00,&local_d0,&local_e8,&local_110,&local_128,&local_140,&local_158);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
            ::operator()(&local_b8,&local_159,(void *)0x0);
  pTVar1 = testing::internal::
           MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
           ::InternalExpectedAt
                     (this_01,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                      ,0x48,"*sdlMock",
                      "createWindow( title, (0x1FFF0000u|(0)), (0x1FFF0000u|(0)), width, height, SDL_WINDOW_SHOWN)"
                     );
  testing::internal::
  MockSpec<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::~MockSpec(&local_b8);
  testing::Matcher<unsigned_int>::~Matcher(&local_158);
  testing::Matcher<int>::~Matcher(&local_140);
  testing::Matcher<int>::~Matcher(&local_128);
  testing::Matcher<int>::~Matcher(&local_110);
  testing::Matcher<int>::~Matcher(&local_e8);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_d0);
  return pTVar1;
}

Assistant:

auto& expectSDLCreateWindow(
        const std::string& title, unsigned width, unsigned height)
    {
        return EXPECT_CALL(*sdlMock, createWindow(
            title, SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED,
            width, height, SDL_WINDOW_SHOWN)
        );
    }